

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binding_alias.cpp
# Opt level: O1

void __thiscall duckdb::BindingAlias::BindingAlias(BindingAlias *this,StandardEntry *entry)

{
  pointer pcVar1;
  SchemaCatalogEntry *pSVar2;
  int iVar3;
  undefined4 extraout_var;
  string *psVar4;
  
  iVar3 = (*(entry->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry[0xc])(entry);
  psVar4 = Catalog::GetName_abi_cxx11_((Catalog *)CONCAT44(extraout_var,iVar3));
  (this->catalog)._M_dataplus._M_p = (pointer)&(this->catalog).field_2;
  pcVar1 = (psVar4->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + psVar4->_M_string_length);
  pSVar2 = entry->schema;
  (this->schema)._M_dataplus._M_p = (pointer)&(this->schema).field_2;
  pcVar1 = (pSVar2->super_InCatalogEntry).super_CatalogEntry.name._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->schema,pcVar1,
             pcVar1 + (pSVar2->super_InCatalogEntry).super_CatalogEntry.name._M_string_length);
  (this->alias)._M_dataplus._M_p = (pointer)&(this->alias).field_2;
  pcVar1 = (entry->super_InCatalogEntry).super_CatalogEntry.name._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->alias,pcVar1,
             pcVar1 + (entry->super_InCatalogEntry).super_CatalogEntry.name._M_string_length);
  return;
}

Assistant:

BindingAlias::BindingAlias(const StandardEntry &entry)
    : catalog(entry.ParentCatalog().GetName()), schema(entry.schema.name), alias(entry.name) {
}